

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::Constraint::visit<slang::ast::DistVarVisitor>(Constraint *this,DistVarVisitor *visitor)

{
  logic_error *this_00;
  string local_f0;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  DistVarVisitor *local_18;
  DistVarVisitor *visitor_local;
  Constraint *this_local;
  
  local_18 = visitor;
  visitor_local = (DistVarVisitor *)this;
  switch(this->kind) {
  case Invalid:
    DistVarVisitor::visit<slang::ast::Constraint>(visitor,this);
    break;
  case List:
    DistVarVisitor::visit<slang::ast::ConstraintList>(visitor,(ConstraintList *)this);
    break;
  case Expression:
    DistVarVisitor::visit<slang::ast::ExpressionConstraint>(visitor,(ExpressionConstraint *)this);
    break;
  case Implication:
    DistVarVisitor::visit<slang::ast::ImplicationConstraint>(visitor,(ImplicationConstraint *)this);
    break;
  case Conditional:
    DistVarVisitor::visit<slang::ast::ConditionalConstraint>(visitor,(ConditionalConstraint *)this);
    break;
  case Uniqueness:
    DistVarVisitor::visit<slang::ast::UniquenessConstraint>(visitor,(UniquenessConstraint *)this);
    break;
  case DisableSoft:
    DistVarVisitor::visit<slang::ast::DisableSoftConstraint>(visitor,(DisableSoftConstraint *)this);
    break;
  case SolveBefore:
    DistVarVisitor::visit<slang::ast::SolveBeforeConstraint>(visitor,(SolveBeforeConstraint *)this);
    break;
  case Foreach:
    DistVarVisitor::visit<slang::ast::ForeachConstraint>(visitor,(ForeachConstraint *)this);
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
               ,&local_b9);
    std::operator+(&local_98,&local_b8,":");
    std::__cxx11::to_string(&local_f0,0x181);
    std::operator+(&local_78,&local_98,&local_f0);
    std::operator+(&local_58,&local_78,": ");
    std::operator+(&local_38,&local_58,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_38);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

decltype(auto) Constraint::visit(TVisitor& visitor, Args&&... args) const {
    // clang-format off
#define CASE(k, n) case ConstraintKind::k: return visitor.visit(*static_cast<const n*>(this), std::forward<Args>(args)...)
    switch (kind) {
        case ConstraintKind::Invalid: return visitor.visit(*this, std::forward<Args>(args)...);
        CASE(List, ConstraintList);
        CASE(Expression, ExpressionConstraint);
        CASE(Implication, ImplicationConstraint);
        CASE(Conditional, ConditionalConstraint);
        CASE(Uniqueness, UniquenessConstraint);
        CASE(DisableSoft, DisableSoftConstraint);
        CASE(SolveBefore, SolveBeforeConstraint);
        CASE(Foreach, ForeachConstraint);
    }
#undef CASE
    // clang-format on
    ASSUME_UNREACHABLE;
}